

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int * __thiscall ConvexDecomposition::cbtHullTriangle::neib(cbtHullTriangle *this,int a,int b)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = 0;
  while( true ) {
    iVar2 = (&(this->super_int3).x)[uVar3];
    uVar1 = uVar3 + 1;
    uVar5 = uVar1 & 0xffffffff;
    if (uVar3 == 2) {
      uVar5 = 0;
    }
    if (((iVar2 == a) && ((&(this->super_int3).x)[uVar5] == b)) ||
       ((iVar2 == b && ((&(this->super_int3).x)[uVar5] == a)))) break;
    uVar3 = uVar1;
    if (uVar1 == 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x943,"int &ConvexDecomposition::cbtHullTriangle::neib(int, int)");
    }
  }
  lVar4 = 2;
  if (uVar3 != 0) {
    lVar4 = uVar3 - 1;
  }
  return &(this->n).x + lVar4;
}

Assistant:

int &cbtHullTriangle::neib(int a,int b)
{
	static int er=-1;
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		if((*this)[i]==a && (*this)[i1]==b) return n[i2];
		if((*this)[i]==b && (*this)[i1]==a) return n[i2];
	}
	assert(0);
	return er;
}